

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  int iVar1;
  WalCkptInfo *pWVar2;
  Wal *in_RCX;
  int in_EDX;
  Wal *in_RDI;
  long in_FS_OFFSET;
  void *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  _func_int_void_ptr *xBusy2;
  Wal *in_stack_00000020;
  int eMode2;
  int rc;
  int isChanged;
  u8 *in_stack_00000060;
  undefined8 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  int local_40;
  int local_10;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->readOnly == '\0') {
    iVar3 = in_EDX;
    local_40 = walLockExclusive((Wal *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                                ,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    if ((local_40 == 0) && (in_RDI->ckptLock = '\x01', in_EDX != 0)) {
      local_40 = walBusyLock(in_RCX,(_func_int_void_ptr *)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                             (int)in_stack_ffffffffffffff98);
      if (local_40 == 0) {
        in_RDI->writeLock = '\x01';
      }
      else if (local_40 == 5) {
        iVar3 = 0;
        in_RCX = (Wal *)0x0;
        local_40 = 0;
      }
    }
    if (local_40 == 0) {
      local_40 = walIndexReadHdr((Wal *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),(int *)in_RCX);
    }
    if (local_40 == 0) {
      if (((in_RDI->hdr).mxFrame == 0) || (iVar1 = walPagesize(in_RDI), iVar1 == in_stack_00000008))
      {
        in_stack_ffffffffffffff98 = CONCAT44(in_stack_00000014,in_stack_00000010);
        local_40 = walCheckpoint(in_stack_00000020,(sqlite3 *)xBusy2,in_stack_00000014,
                                 (_func_int_void_ptr *)CONCAT44(in_stack_0000000c,in_stack_00000008)
                                 ,unaff_retaddr,(int)((ulong)lVar4 >> 0x20),in_stack_00000060);
      }
      else {
        local_40 = sqlite3CorruptError(0);
      }
      if ((local_40 == 0) || (local_40 == 5)) {
        if (xBusy2 != (_func_int_void_ptr *)0x0) {
          *(u32 *)xBusy2 = (in_RDI->hdr).mxFrame;
        }
        if (in_stack_00000020 != (Wal *)0x0) {
          pWVar2 = walCkptInfo(in_RDI);
          *(u32 *)&in_stack_00000020->pVfs = pWVar2->nBackfill;
        }
      }
    }
    sqlite3WalEndWriteTransaction((Wal *)0x16777d);
    if (in_RDI->ckptLock != '\0') {
      walUnlockExclusive((Wal *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (int)in_stack_ffffffffffffff98);
      in_RDI->ckptLock = '\0';
    }
    local_10 = local_40;
    if ((local_40 == 0) && (in_EDX != iVar3)) {
      local_10 = 5;
    }
  }
  else {
    local_10 = 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. */
  sqlite3WalDb(pWal, db);
  if( xBusy2 ) (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  SEH_TRY {
    if( rc==SQLITE_OK ){
      /* For a passive checkpoint, do not re-enable blocking locks after
      ** reading the wal-index header. A passive checkpoint should not block
      ** or invoke the busy handler. The only lock such a checkpoint may
      ** attempt to obtain is a lock on a read-slot, and it should give up
      ** immediately and do a partial checkpoint if it cannot obtain it. */
      walDisableBlocking(pWal);
      rc = walIndexReadHdr(pWal, &isChanged);
      if( eMode2!=SQLITE_CHECKPOINT_PASSIVE ) (void)walEnableBlocking(pWal);
      if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
        sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
      }
    }

    /* Copy data from the log to the database file. */
    if( rc==SQLITE_OK ){
      if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags,zBuf);
      }

      /* If no error occurred, set the output variables. */
      if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
        if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
        SEH_INJECT_FAULT;
        if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
      }
    }
  }
  SEH_EXCEPT( rc = walHandleException(pWal); )

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}